

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O0

QCursor __thiscall
QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::separatorCursor
          (QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *this,QList<int> *path)

{
  QMainWindowLayout *this_00;
  QDockAreaLayoutInfo *pQVar1;
  qsizetype qVar2;
  uint *puVar3;
  QDockAreaLayout *in_RDX;
  CursorShape CVar4;
  QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *in_RSI;
  QCursorData *in_RDI;
  QDockAreaLayoutInfo *info;
  QCursorData *this_01;
  QList<int> *in_stack_ffffffffffffffe0;
  
  this_01 = in_RDI;
  this_00 = layout(in_RSI);
  QMainWindowLayout::dockAreaLayoutInfo((QMainWindowLayout *)this_00);
  pQVar1 = QDockAreaLayout::info(in_RDX,in_stack_ffffffffffffffe0);
  qVar2 = QList<int>::size((QList<int> *)in_RDX);
  if (qVar2 == 1) {
    puVar3 = (uint *)QList<int>::first((QList<int> *)this_01);
    if (*puVar3 < 2) {
      QCursor::QCursor((QCursor *)this_01,SplitHCursor);
      return (QCursor)in_RDI;
    }
    if (*puVar3 - 2 < 2) {
      QCursor::QCursor((QCursor *)this_01,SplitVCursor);
      return (QCursor)in_RDI;
    }
  }
  CVar4 = SplitVCursor;
  if (pQVar1->o == Horizontal) {
    CVar4 = SplitHCursor;
  }
  QCursor::QCursor((QCursor *)this_01,CVar4);
  return (QCursor)in_RDI;
}

Assistant:

QCursor QMainWindowLayoutSeparatorHelper<Layout>::separatorCursor(const QList<int> &path)
{
    const QDockAreaLayoutInfo *info = layout()->dockAreaLayoutInfo()->info(path);
    Q_ASSERT(info != nullptr);
    if (path.size() == 1) { // is this the "top-level" separator which separates a dock area
                            // from the central widget?
        switch (path.first()) {
        case QInternal::LeftDock:
        case QInternal::RightDock:
            return Qt::SplitHCursor;
        case QInternal::TopDock:
        case QInternal::BottomDock:
            return Qt::SplitVCursor;
        default:
            break;
        }
    }

    // no, it's a splitter inside a dock area, separating two dock widgets

    return info->o == Qt::Horizontal ? Qt::SplitHCursor : Qt::SplitVCursor;
}